

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

char * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::SnailAllocPages<true>
          (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           *this,uint pageCount,
          PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> **pageSegment)

{
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 *puVar5;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *pPVar6;
  char *pcVar7;
  
  iVar3 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar3 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x577,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar2) goto LAB_006794f0;
    *puVar5 = 0;
  }
  this_00 = &this->emptySegments;
  if ((DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
      (this->emptySegments).
      super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>.next.
      base != this_00) {
    pPVar6 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
             Head(this_00);
    pcVar7 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::AllocPages<true>
                       (pPVar6,pageCount);
    if (pcVar7 != (char *)0x0) {
      OnAllocFromNewSegment
                (this,pageCount,pcVar7,
                 &pPVar6->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
      *pageSegment = pPVar6;
      return pcVar7;
    }
  }
  pcVar7 = TryAllocDecommittedPages<true>(this,pageCount,pageSegment);
  if (pcVar7 != (char *)0x0) {
    FillAllocPages(this,pcVar7,pageCount);
    return pcVar7;
  }
  uVar4 = this->maxAllocPageCount;
  if (uVar4 < pageCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x5a9,"(maxAllocPageCount >= pageCount)","maxAllocPageCount >= pageCount");
    if (!bVar2) goto LAB_006794f0;
    *puVar5 = 0;
    uVar4 = this->maxAllocPageCount;
  }
  if ((uVar4 - pageCount == 0) ||
     ((ulong)(uVar4 - pageCount) + this->freePageCount <= (ulong)this->maxFreePageCount)) {
    pPVar6 = AddPageSegment(this,this_00);
    if (pPVar6 != (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)0x0) {
      pcVar7 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::AllocPages<true>
                         (pPVar6,pageCount);
      if (pcVar7 != (char *)0x0) {
        OnAllocFromNewSegment
                  (this,pageCount,pcVar7,
                   &pPVar6->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
        *pageSegment = pPVar6;
        return pcVar7;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x5d5,"(pages != nullptr)","pages != nullptr");
      if (!bVar2) {
LAB_006794f0:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  else {
    pPVar6 = AllocPageSegment(&this->decommitSegments,this,false,false,this->enableWriteBarrier);
    if (pPVar6 == (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)0x0) {
      return (char *)0x0;
    }
    pcVar7 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DoAllocDecommitPages<true>
                       (pPVar6,pageCount);
    if (pcVar7 != (char *)0x0) {
      this->decommitPageCount = this->decommitPageCount + (ulong)pPVar6->decommitPageCount;
      FillAllocPages(this,pcVar7,pageCount);
      LogRecommitPages(this,(ulong)pageCount);
      LogAllocPages(this,(ulong)pageCount);
      *pageSegment = pPVar6;
      return pcVar7;
    }
  }
  return (char *)0x0;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::SnailAllocPages(uint pageCount, TPageSegment ** pageSegment)
{
    Assert(!this->HasMultiThreadAccess());

    char * pages = nullptr;
    TPageSegment * newSegment = nullptr;

    if (!emptySegments.Empty())
    {
        newSegment = &emptySegments.Head();

        if (!notPageAligned && !TPageSegment::IsAllocationPageAligned(newSegment->GetAddress(), pageCount))
        {
            newSegment = nullptr;

            // Scan through the empty segments for a segment that can fit this allocation
            FOREACH_DLISTBASE_ENTRY_EDITING(TPageSegment, emptySegment, &this->emptySegments, iter)
            {
                if (TPageSegment::IsAllocationPageAligned(emptySegment.GetAddress(), pageCount))
                {
                    iter.MoveCurrentTo(&this->emptySegments);
                    newSegment = &emptySegment;
                    break;
                }
            }
            NEXT_DLISTBASE_ENTRY_EDITING
        }

        if (newSegment != nullptr)
        {
            pages = newSegment->template AllocPages<notPageAligned>(pageCount);
            if (pages != nullptr)
            {
                OnAllocFromNewSegment(pageCount, pages, newSegment);
                *pageSegment = newSegment;
                return pages;
            }
        }
    }

    pages = TryAllocDecommittedPages<notPageAligned>(pageCount, pageSegment);
    if (pages != nullptr)
    {
        // TryAllocDecommittedPages may give out a mix of free pages and decommitted pages.
        // Free pages are filled with 0xFE in debug build, so we need to zero them
        // out before giving it out. In release build, free page is already zeroed
        // in ReleasePages
        this->FillAllocPages(pages, pageCount);
        return pages;
    }

    Assert(pages == nullptr);
    Assert(maxAllocPageCount >= pageCount);
    if (maxAllocPageCount != pageCount && (maxFreePageCount < maxAllocPageCount - pageCount + freePageCount))
    {
        // If we exceed the number of max free page count, allocate from a new fully decommit block
        TPageSegment * decommitSegment = AllocPageSegment(
            this->decommitSegments, this, false, false, this->enableWriteBarrier);
        if (decommitSegment == nullptr)
        {
            return nullptr;
        }

        pages = decommitSegment->template DoAllocDecommitPages<notPageAligned>(pageCount);
        if (pages != nullptr)
        {
#if DBG_DUMP
            this->decommitPageCount = this->decommitPageCount + decommitSegment->GetDecommitPageCount();
#endif
            this->FillAllocPages(pages, pageCount);

            LogRecommitPages(pageCount);
            LogAllocPages(pageCount);

            *pageSegment = decommitSegment;
        }
        return pages;
    }

    // At this point, we haven't been able to allocate either from the
    // decommitted pages, or from the empty segment list, so we'll
    // try allocating a segment. In a page allocator with a pre-reserved segment,
    // we're not allowed to allocate additional segments so return here.
    // Otherwise, add a new segment and allocate from it

    newSegment = AddPageSegment(emptySegments);
    if (newSegment == nullptr)
    {
        return nullptr;
    }

    pages = newSegment->template AllocPages<notPageAligned>(pageCount);
    if (notPageAligned)
    {
        // REVIEW: Is this true for single-chunk allocations too? Are new segments guaranteed to
        // allow for single-chunk allocations to succeed?
        Assert(pages != nullptr);
    }

    if (pages != nullptr)
    {
        OnAllocFromNewSegment(pageCount, pages, newSegment);
        *pageSegment = newSegment;
    }

    return pages;
}